

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::writePlotFile(AmrLevel *this,string *dir,ostream *os,How how)

{
  uint uVar1;
  element_type *peVar2;
  Real RVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  IndexType IVar8;
  StateDescriptor *pSVar9;
  string *psVar10;
  _List_node_base *p_Var11;
  IndexSpace *pIVar12;
  ostream *poVar13;
  DeriveRec *pDVar14;
  string *psVar15;
  MultiFab *src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dname;
  ulong uVar16;
  long lVar17;
  pointer name;
  int lev;
  int iVar18;
  long lVar19;
  ulong uVar20;
  _List_node_base *p_Var21;
  long lVar22;
  long lVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  string FullPath;
  string TheFullPath;
  string sLevel;
  MultiFab plotMF;
  char buf [64];
  
  plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plot_var_map.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar18 = 0; iVar6 = DescriptorList::size((DescriptorList *)desc_lst), iVar18 < iVar6;
      iVar18 = iVar18 + 1) {
    iVar6 = 0;
    while( true ) {
      pSVar9 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar18);
      iVar7 = StateDescriptor::nComp(pSVar9);
      if (iVar7 <= iVar6) break;
      pSVar9 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar18);
      psVar10 = StateDescriptor::name_abi_cxx11_(pSVar9,iVar6);
      bVar5 = Amr::isStatePlotVar(psVar10);
      if (bVar5) {
        pSVar9 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar18);
        IVar8 = StateDescriptor::getType(pSVar9);
        if (IVar8.itype == 0) {
          plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
               iVar18;
          plotMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
               iVar6;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&plot_var_map,
                     (pair<int,_int> *)&plotMF);
        }
      }
      iVar6 = iVar6 + 1;
    }
  }
  derive_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  derive_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  derive_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var11 = (_List_node_base *)DeriveList::dlist_abi_cxx11_((DeriveList *)derive_lst);
  iVar18 = 0;
  p_Var21 = p_Var11;
  while (p_Var21 = (((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                    &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var21 != p_Var11) {
    pDVar14 = (DeriveRec *)(p_Var21 + 1);
    psVar10 = DeriveRec::name_abi_cxx11_(pDVar14);
    bVar5 = Amr::isDerivePlotVar(psVar10);
    if (bVar5) {
      psVar10 = DeriveRec::name_abi_cxx11_(pDVar14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&derive_names,psVar10);
      iVar6 = DeriveRec::numDerive(pDVar14);
      iVar18 = iVar18 + iVar6;
    }
  }
  uVar16 = (long)plot_var_map.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)plot_var_map.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  pIVar12 = EB2::TopIndexSpaceIfPresent();
  iVar18 = ((iVar18 + 1) - (uint)(pIVar12 == (IndexSpace *)0x0)) + (int)(uVar16 >> 3);
  RVar3 = StateData::curTime((this->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if ((this->level == 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    (*this->_vptr_AmrLevel[3])(&plotMF);
    poVar13 = std::operator<<(os,(string *)&plotMF);
    std::operator<<(poVar13,'\n');
    std::__cxx11::string::~string((string *)&plotMF);
    if (iVar18 == 0) {
      Error_host("Must specify at least one valid data item to plot");
    }
    poVar13 = (ostream *)std::ostream::operator<<(os,iVar18);
    std::operator<<(poVar13,'\n');
    for (lVar19 = 0;
        pbVar4 = derive_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        psVar10 = derive_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar19 < (int)((ulong)((long)plot_var_map.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)plot_var_map.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar19 = lVar19 + 1) {
      iVar6 = plot_var_map.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[lVar19].second;
      pSVar9 = DescriptorList::operator[]
                         ((DescriptorList *)desc_lst,
                          plot_var_map.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar19].first);
      psVar10 = StateDescriptor::name_abi_cxx11_(pSVar9,iVar6);
      poVar13 = std::operator<<(os,(string *)psVar10);
      std::operator<<(poVar13,'\n');
    }
    for (; psVar10 != pbVar4; psVar10 = psVar10 + 1) {
      pDVar14 = DeriveList::get((DeriveList *)derive_lst,psVar10);
      for (iVar6 = 0; iVar7 = DeriveRec::numDerive(pDVar14), iVar6 < iVar7; iVar6 = iVar6 + 1) {
        psVar15 = DeriveRec::variableName_abi_cxx11_(pDVar14,iVar6);
        poVar13 = std::operator<<(os,(string *)psVar15);
        std::operator<<(poVar13,'\n');
      }
    }
    pIVar12 = EB2::TopIndexSpaceIfPresent();
    if (pIVar12 != (IndexSpace *)0x0) {
      std::operator<<(os,"vfrac\n");
    }
    poVar13 = (ostream *)std::ostream::operator<<(os,3);
    std::operator<<(poVar13,'\n');
    poVar13 = std::ostream::_M_insert<double>(this->parent->cumtime);
    std::operator<<(poVar13,'\n');
    uVar1 = *(uint *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    poVar13 = (ostream *)std::ostream::operator<<(os,uVar1);
    std::operator<<(poVar13,'\n');
    lVar23 = (long)(int)uVar1;
    for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
      poVar13 = std::ostream::_M_insert<double>((this->geom).prob_domain.xlo[lVar19]);
      std::operator<<(poVar13,' ');
    }
    std::operator<<(os,'\n');
    for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
      poVar13 = std::ostream::_M_insert<double>((this->geom).prob_domain.xhi[lVar19]);
      std::operator<<(poVar13,' ');
    }
    std::operator<<(os,'\n');
    uVar20 = 0;
    uVar16 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar16 = uVar20;
    }
    for (; uVar16 * 0xc - uVar20 != 0; uVar20 = uVar20 + 0xc) {
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (os,*(int *)((long)((this->parent->super_AmrCore).super_AmrMesh.
                                              super_AmrInfo.ref_ratio.
                                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                              .
                                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->vect +
                                      uVar20));
      std::operator<<(poVar13,' ');
    }
    std::operator<<(os,'\n');
    lVar19 = 0xac;
    for (lVar22 = 0; lVar22 <= lVar23; lVar22 = lVar22 + 1) {
      poVar13 = amrex::operator<<(os,(Box *)((long)(((this->parent->super_AmrCore).super_AmrMesh.
                                                     geom.
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super_CoordSys).offset + lVar19 + -8));
      std::operator<<(poVar13,' ');
      lVar19 = lVar19 + 200;
    }
    std::operator<<(os,'\n');
    for (lVar19 = 0; lVar19 <= lVar23; lVar19 = lVar19 + 1) {
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar19]);
      std::operator<<(poVar13,' ');
    }
    std::operator<<(os,'\n');
    lVar19 = 0x20;
    for (lVar22 = 0; lVar22 <= lVar23; lVar22 = lVar22 + 1) {
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        poVar13 = std::ostream::_M_insert<double>
                            (*(double *)
                              ((long)(((this->parent->super_AmrCore).super_AmrMesh.geom.
                                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       .
                                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                     offset + lVar17 * 8 + lVar19 + -8));
        std::operator<<(poVar13,' ');
      }
      std::operator<<(os,'\n');
      lVar19 = lVar19 + 200;
    }
    poVar13 = (ostream *)std::ostream::operator<<(os,(this->geom).super_CoordSys.c_sys);
    std::operator<<(poVar13,'\n');
    std::operator<<(os,"0\n");
  }
  if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
       BaseName_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                   ::BaseName_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                BaseName_abi_cxx11_,"/Cell",(allocator *)&plotMF);
    __cxa_atexit(std::__cxx11::string::~string,
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                         ::BaseName_abi_cxx11_);
  }
  sprintf(buf,"Level_%d",(ulong)(uint)this->level);
  std::__cxx11::string::string((string *)&sLevel,buf,(allocator *)&plotMF);
  std::__cxx11::string::string((string *)&FullPath,(string *)dir);
  if ((FullPath._M_string_length != 0) &&
     (FullPath._M_dataplus._M_p[FullPath._M_string_length - 1] != '/')) {
    std::__cxx11::string::push_back((char)&FullPath);
  }
  std::__cxx11::string::append((string *)&FullPath);
  if (this->levelDirectoryCreated == false) {
    if ((*(int *)(ParallelContext::frames + 0xc) == 0) &&
       (bVar5 = UtilCreateDirectory(&FullPath,0x1ed,false), !bVar5)) {
      CreateDirectoryFailed(&FullPath);
    }
    ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar13 = (ostream *)std::ostream::operator<<(os,this->level);
    poVar13 = std::operator<<(poVar13,' ');
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    std::operator<<(poVar13,' ');
    poVar13 = std::ostream::_M_insert<double>(RVar3);
    std::operator<<(poVar13,'\n');
    poVar13 = (ostream *)
              std::ostream::operator<<
                        (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[this->level]);
    std::operator<<(poVar13,'\n');
    for (lVar19 = 0;
        peVar2 = (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,
        lVar19 < ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data) / 0x1c; lVar19 = lVar19 + 1) {
      BoxArray::operator[]((Box *)&TheFullPath,&this->grids,(int)lVar19);
      RealBox::RealBox((RealBox *)&plotMF,(Box *)&TheFullPath,(this->geom).super_CoordSys.dx,
                       (this->geom).prob_domain.xlo);
      for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
        poVar13 = std::ostream::_M_insert<double>(*(double *)(buf + lVar23 * 8 + -0x180));
        std::operator<<(poVar13,' ');
        poVar13 = std::ostream::_M_insert<double>(*(double *)(buf + lVar23 * 8 + -0x168));
        std::operator<<(poVar13,'\n');
      }
    }
    if (0 < iVar18) {
      std::__cxx11::string::string((string *)&plotMF,(string *)&sLevel);
      std::__cxx11::string::append((string *)&plotMF);
      poVar13 = std::operator<<(os,(string *)&plotMF);
      std::operator<<(poVar13,'\n');
      std::__cxx11::string::~string((string *)&plotMF);
    }
    pIVar12 = EB2::TopIndexSpaceIfPresent();
    if ((pIVar12 != (IndexSpace *)0x0) &&
       (iVar6 = this->level,
       iVar6 == *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c)) {
      for (iVar7 = 0; iVar7 <= iVar6; iVar7 = iVar7 + 1) {
        std::operator<<(os,"1.0e-6\n");
        iVar6 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      }
    }
  }
  TheFullPath._M_dataplus._M_p = (pointer)0x1;
  TheFullPath._M_string_length = 0;
  TheFullPath.field_2._M_allocated_capacity = 0;
  TheFullPath.field_2._8_8_ = 0;
  MultiFab::MultiFab(&plotMF,&this->grids,&this->dmap,iVar18,0,(MFInfo *)&TheFullPath,
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&TheFullPath.field_2);
  for (uVar16 = 0;
      pbVar4 = derive_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      (long)uVar16 <
      (long)(int)((ulong)((long)plot_var_map.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)plot_var_map.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3); uVar16 = uVar16 + 1
      ) {
    MultiFab::Copy(&plotMF,(MultiFab *)
                           (this->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [plot_var_map.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].first].new_data._M_t.
                           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                   ,plot_var_map.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar16].second,(int)uVar16,1,0);
  }
  if (derive_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      derive_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    for (name = derive_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pbVar4; name = name + 1) {
      (*this->_vptr_AmrLevel[0x20])(SUB84(RVar3,0),this,name,&plotMF);
      pDVar14 = DeriveList::get((DeriveList *)derive_lst,name);
      iVar18 = DeriveRec::numDerive(pDVar14);
      uVar16 = (ulong)(uint)((int)uVar16 + iVar18);
    }
  }
  pIVar12 = EB2::TopIndexSpaceIfPresent();
  if (pIVar12 != (IndexSpace *)0x0) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&plotMF.super_FabArray<amrex::FArrayBox>,0.0,(int)uVar16,1,0);
    src = EBFArrayBoxFactory::getVolFrac
                    ((EBFArrayBoxFactory *)
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
    MultiFab::Copy(&plotMF,src,0,(int)uVar16,1,0);
  }
  std::__cxx11::string::string((string *)&TheFullPath,(string *)&FullPath);
  std::__cxx11::string::append((string *)&TheFullPath);
  bVar5 = AsyncOut::UseAsyncOut();
  if (bVar5) {
    VisMF::AsyncWrite(&plotMF.super_FabArray<amrex::FArrayBox>,&TheFullPath,false);
  }
  else {
    VisMF::Write(&plotMF.super_FabArray<amrex::FArrayBox>,&TheFullPath,how,true);
  }
  this->levelDirectoryCreated = false;
  std::__cxx11::string::~string((string *)&TheFullPath);
  MultiFab::~MultiFab(&plotMF);
  std::__cxx11::string::~string((string *)&FullPath);
  std::__cxx11::string::~string((string *)&sLevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&derive_names);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&plot_var_map.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return;
}

Assistant:

void
AmrLevel::writePlotFile (const std::string& dir,
                         std::ostream&      os,
                         VisMF::How         how)
{
    int i, n;
    //
    // The list of indices of State to write to plotfile.
    // first component of pair is state_type,
    // second component of pair is component # within the state_type
    //
    std::vector<std::pair<int,int> > plot_var_map;
    for (int typ = 0; typ < desc_lst.size(); typ++)
    {
        for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
        {
            if (parent->isStatePlotVar(desc_lst[typ].name(comp)) &&
                desc_lst[typ].getType() == IndexType::TheCellType())
            {
                plot_var_map.push_back(std::pair<int,int>(typ,comp));
            }
        }
    }

    int num_derive = 0;
    std::vector<std::string> derive_names;
    const std::list<DeriveRec>& dlist = derive_lst.dlist();
    for (auto const& d : dlist)
    {
        if (parent->isDerivePlotVar(d.name()))
        {
            derive_names.push_back(d.name());
            num_derive += d.numDerive();
        }
    }

    int n_data_items = plot_var_map.size() + num_derive;

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        n_data_items += 1;
    }
#endif

    // get the time from the first State_Type
    // if the State_Type is ::Interval, this will get t^{n+1/2} instead of t^n
    Real cur_time = state[0].curTime();

    if (level == 0 && ParallelDescriptor::IOProcessor())
    {
        //
        // The first thing we write out is the plotfile type.
        //
        os << thePlotFileType() << '\n';

        if (n_data_items == 0)
            amrex::Error("Must specify at least one valid data item to plot");

        os << n_data_items << '\n';

        //
        // Names of variables
        //
        for (i =0; i < static_cast<int>(plot_var_map.size()); i++)
        {
            int typ = plot_var_map[i].first;
            int comp = plot_var_map[i].second;
            os << desc_lst[typ].name(comp) << '\n';
        }

        // derived
        for (auto const& dname : derive_names) {
            const DeriveRec* rec = derive_lst.get(dname);
            for (i = 0; i < rec->numDerive(); ++i) {
                os << rec->variableName(i) << '\n';
            }
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            os << "vfrac\n";
        }
#endif

        os << AMREX_SPACEDIM << '\n';
        os << parent->cumTime() << '\n';
        int f_lev = parent->finestLevel();
        os << f_lev << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbLo(i) << ' ';
        os << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbHi(i) << ' ';
        os << '\n';
        for (i = 0; i < f_lev; i++)
            os << parent->refRatio(i)[0] << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->Geom(i).Domain() << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->levelSteps(i) << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
        {
            for (int k = 0; k < AMREX_SPACEDIM; k++)
                os << parent->Geom(i).CellSize()[k] << ' ';
            os << '\n';
        }
        os << (int) Geom().Coord() << '\n';
        os << "0\n"; // Write bndry data.

    }
    // Build the directory to hold the MultiFab at this level.
    // The name is relative to the directory containing the Header file.
    //
    static const std::string BaseName = "/Cell";
    char buf[64];
    sprintf(buf, "Level_%d", level);
    std::string sLevel = buf;
    //
    // Now for the full pathname of that directory.
    //
    std::string FullPath = dir;
    if ( ! FullPath.empty() && FullPath[FullPath.size()-1] != '/')
    {
        FullPath += '/';
    }
    FullPath += sLevel;
    //
    // Only the I/O processor makes the directory if it doesn't already exist.
    //
    if ( ! levelDirectoryCreated) {
        if (ParallelDescriptor::IOProcessor()) {
            if ( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
                amrex::CreateDirectoryFailed(FullPath);
            }
        }
        // Force other processors to wait until directory is built.
        ParallelDescriptor::Barrier();
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << ' ' << grids.size() << ' ' << cur_time << '\n';
        os << parent->levelSteps(level) << '\n';

        for (i = 0; i < grids.size(); ++i)
        {
            RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
            for (n = 0; n < AMREX_SPACEDIM; n++)
                os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
        }
        //
        // The full relative pathname of the MultiFabs at this level.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        if (n_data_items > 0)
        {
            std::string PathNameInHeader = sLevel;
            PathNameInHeader += BaseName;
            os << PathNameInHeader << '\n';
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            // volfrac threshold for amrvis
            if (level == parent->finestLevel()) {
                for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                    os << "1.0e-6\n";
                }
            }
        }
#endif
    }
    //
    // We combine all of the multifabs -- state, derived, etc -- into one
    // multifab -- plotMF.
    int       cnt   = 0;
    const int nGrow = 0;
    MultiFab  plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
    MultiFab* this_dat = 0;
    //
    // Cull data from state variables -- use no ghost cells.
    //
    for (i = 0; i < static_cast<int>(plot_var_map.size()); i++)
    {
        int typ  = plot_var_map[i].first;
        int comp = plot_var_map[i].second;
        this_dat = &state[typ].newData();
        MultiFab::Copy(plotMF,*this_dat,comp,cnt,1,nGrow);
        cnt++;
    }

    // derived
    if (derive_names.size() > 0)
    {
        for (auto const& dname : derive_names)
        {
            derive(dname, cur_time, plotMF, cnt);
            cnt += derive_lst.get(dname)->numDerive();
        }
    }

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        plotMF.setVal(0.0, cnt, 1, nGrow);
        auto factory = static_cast<EBFArrayBoxFactory*>(m_factory.get());
        MultiFab::Copy(plotMF,factory->getVolFrac(),0,cnt,1,nGrow);
    }
#endif

    //
    // Use the Full pathname when naming the MultiFab.
    //
    std::string TheFullPath = FullPath;
    TheFullPath += BaseName;
    if (AsyncOut::UseAsyncOut()) {
        VisMF::AsyncWrite(plotMF,TheFullPath);
    } else {
        VisMF::Write(plotMF,TheFullPath,how,true);
    }

    levelDirectoryCreated = false;  // ---- now that the plotfile is finished
}